

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveAttachExpr(NameContext *pName,Expr *pExpr)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined1 auStack_60 [40];
  anon_union_8_18_67db040d_for_u aStack_38;
  long lStack_30;
  
  if (pExpr != (Expr *)0x0) {
    if (pExpr->op != '<') {
      lStack_30 = *(long *)(in_FS_OFFSET + 0x28);
      if (pExpr == (Expr *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar1 = pName->ncFlags;
        pName->ncFlags = uVar1 & 0xf7ff6fef;
        auStack_60._0_8_ = pName->pParse;
        auStack_60._8_8_ = resolveExprStep;
        auStack_60._16_8_ = (_func_int_Walker_ptr_Select_ptr *)0x0;
        if ((uVar1 >> 0x13 & 1) == 0) {
          auStack_60._16_8_ = resolveSelectStep;
        }
        auStack_60._24_8_ = (_func_void_Walker_ptr_Select_ptr *)0x0;
        iVar4 = ((Parse *)auStack_60._0_8_)->nHeight + pExpr->nHeight;
        ((Parse *)auStack_60._0_8_)->nHeight = iVar4;
        aStack_38.pNC = pName;
        iVar4 = sqlite3ExprCheckHeight((Parse *)auStack_60._0_8_,iVar4);
        uVar3 = 1;
        if (iVar4 == 0) {
          auStack_60._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
          sqlite3WalkExprNN((Walker *)auStack_60,pExpr);
          *(int *)(auStack_60._0_8_ + 0x13c) = *(int *)(auStack_60._0_8_ + 0x13c) - pExpr->nHeight;
          uVar2 = pName->ncFlags;
          pExpr->flags = pExpr->flags | uVar2 & 0x8010;
          pName->ncFlags = uVar1 & 0x8009010 | uVar2;
          if (pName->nNcErr < 1) {
            uVar3 = (uint)(0 < *(int *)(auStack_60._0_8_ + 0x34));
          }
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lStack_30) {
        return uVar3;
      }
      __stack_chk_fail();
    }
    pExpr->op = 'v';
  }
  return 0;
}

Assistant:

static int resolveAttachExpr(NameContext *pName, Expr *pExpr)
{
  int rc = SQLITE_OK;
  if( pExpr ){
    if( pExpr->op!=TK_ID ){
      rc = sqlite3ResolveExprNames(pName, pExpr);
    }else{
      pExpr->op = TK_STRING;
    }
  }
  return rc;
}